

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseOutgoing.cpp
# Opt level: O3

Result __thiscall
tonk::SessionOutgoing::QueueReliable
          (SessionOutgoing *this,uint messageType,uint8_t *data,size_t bytes)

{
  bool bVar1;
  char cVar2;
  char cVar3;
  int iVar4;
  size_t sVar5;
  long *plVar6;
  _func_int **pp_Var7;
  long *plVar8;
  ulong uVar9;
  Result *success;
  uint messageType_00;
  undefined4 in_register_00000034;
  long lVar10;
  ulong in_R8;
  long lVar11;
  long *plVar12;
  long local_60;
  long lStack_58;
  char *local_50;
  uint local_48;
  char local_40 [16];
  
  lVar10 = CONCAT44(in_register_00000034,messageType);
  if (in_R8 < 0xfa01) {
    iVar4 = pthread_mutex_lock((pthread_mutex_t *)(lVar10 + 0x238));
    if (iVar4 != 0) {
      std::__throw_system_error(iVar4);
    }
    messageType_00 = (uint)data;
    lVar11 = lVar10 + 0x78;
    if (messageType_00 < 0x12) {
      lVar11 = lVar10 + 0x50;
    }
    sVar5 = OutgoingQueue::AppendSplitReliable
                      ((OutgoingQueue *)(lVar11 + 0x318),messageType_00,(uint8_t *)bytes,in_R8);
    if (sVar5 < in_R8) {
      do {
        OutgoingQueue::PushAndGetFreshBuffer((OutgoingQueue *)this);
        if ((this->super_IIncomingToOutgoing)._vptr_IIncomingToOutgoing != (_func_int **)0x0)
        goto LAB_0012d65d;
        bytes = bytes + sVar5;
        in_R8 = in_R8 - sVar5;
        Result::~Result((Result *)this);
        sVar5 = OutgoingQueue::AppendSplitReliable
                          ((OutgoingQueue *)(lVar11 + 0x318),messageType_00,(uint8_t *)bytes,in_R8);
      } while (sVar5 < in_R8);
    }
    (this->super_IIncomingToOutgoing)._vptr_IIncomingToOutgoing = (_func_int **)0x0;
LAB_0012d65d:
    pthread_mutex_unlock((pthread_mutex_t *)(lVar10 + 0x238));
  }
  else {
    uVar9 = in_R8;
    cVar2 = '\x04';
    do {
      cVar3 = cVar2;
      if (uVar9 < 100) {
        cVar3 = cVar3 + -2;
        goto LAB_0012d672;
      }
      if (uVar9 < 1000) {
        cVar3 = cVar3 + -1;
        goto LAB_0012d672;
      }
      if (uVar9 < 10000) goto LAB_0012d672;
      bVar1 = 99999 < uVar9;
      uVar9 = uVar9 / 10000;
      cVar2 = cVar3 + '\x04';
    } while (bVar1);
    cVar3 = cVar3 + '\x01';
LAB_0012d672:
    local_50 = local_40;
    std::__cxx11::string::_M_construct((ulong)&local_50,cVar3);
    std::__detail::__to_chars_10_impl<unsigned_long>(local_50,local_48,in_R8);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
    plVar8 = plVar6 + 2;
    if ((long *)*plVar6 == plVar8) {
      local_60 = *plVar8;
      lStack_58 = plVar6[3];
      plVar12 = &local_60;
    }
    else {
      local_60 = *plVar8;
      plVar12 = (long *)*plVar6;
    }
    lVar10 = plVar6[1];
    *plVar6 = (long)plVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    pp_Var7 = (_func_int **)operator_new(0x38);
    *pp_Var7 = (_func_int *)"SessionOutgoing::QueueReliableMessage";
    pp_Var7[1] = (_func_int *)(pp_Var7 + 3);
    std::__cxx11::string::_M_construct<char*>
              ((string *)(pp_Var7 + 1),plVar12,lVar10 + (long)plVar12);
    *(undefined4 *)(pp_Var7 + 5) = 0;
    pp_Var7[6] = (_func_int *)0x5;
    (this->super_IIncomingToOutgoing)._vptr_IIncomingToOutgoing = pp_Var7;
    if (plVar12 != &local_60) {
      operator_delete(plVar12);
    }
    if (local_50 != local_40) {
      operator_delete(local_50);
    }
  }
  return (Result)(ErrorResult *)this;
}

Assistant:

Result SessionOutgoing::QueueReliable(
    unsigned messageType,
    const uint8_t* data,
    size_t bytes)
{
    // Note: Compressed type is generated internally by Flush()
    TONK_DEBUG_ASSERT(messageType > protocol::MessageType_Compressed);
    // Control/Unordered must be queued via QueueControl()/QueueUnordered()
    TONK_DEBUG_ASSERT(messageType < protocol::MessageType_Control);

    // WARNING: This function is not called on the Connection green thread,
    // so accessing members here is not threadsafe by default.

    // Check for oversized messages without any additions up front to avoid
    // integer overflow issues
    if (bytes > TONK_MAX_RELIABLE_BYTES)
    {
        return Result("SessionOutgoing::QueueReliableMessage",
            std::to_string(bytes) + " byte message too large",
            ErrorType::Tonk,
            Tonk_MessageTooLarge);
    }

    const unsigned queueIndex = (messageType >= protocol::MessageType_LowPri)
        ? Queue_LowPri : Queue_Reliable;

    Locker locker(OutgoingQueueLock);

    OutgoingQueue* queue = &Queues[queueIndex];

    for (;;)
    {
        // Attempt to append message to OutBuffer
        const size_t written = queue->AppendSplitReliable(messageType, data, bytes);
        TONK_DEBUG_ASSERT(written <= bytes);
        if (written >= bytes) {
            break; // Done
        }

        data += written, bytes -= written;

        // Push the OutBuffer to the send queue and start a new OutBuffer
        const Result result = queue->PushAndGetFreshBuffer();
        if (result.IsFail()) {
            TONK_DEBUG_BREAK();
            return result;
        }
    }

    return Result::Success();
}